

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramQueryCase::iterate
          (GeometryProgramQueryCase *this)

{
  char *__s;
  int iVar1;
  bool bVar2;
  ContextType ctxType;
  GLSLVersion GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  char *pcVar6;
  size_type sVar7;
  TestLog *pTVar8;
  reference pvVar9;
  ProgramSources *pPVar10;
  RenderContext *pRVar11;
  TestError *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_a78;
  undefined1 local_8f2;
  allocator<char> local_8f1;
  string local_8f0;
  undefined1 local_8d0 [8];
  Program program_2;
  Shader geometryShader;
  Shader fragmentShader;
  Shader vertexShader;
  char *geomSourcePtr;
  char *fragSourcePtr;
  char *vtxSourcePtr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  allocator<char> local_711;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  allocator<char> local_6ed;
  ApiType local_6ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  undefined1 local_668 [8];
  string geometrySource_1;
  string local_640;
  allocator<char> local_619;
  string local_618;
  ScopedLogSection local_5f8;
  ScopedLogSection section_2;
  ShaderSource local_5c8;
  ProgramSources local_5a0;
  undefined1 local_4d0 [8];
  ShaderProgram program_1;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  ScopedLogSection local_3b0;
  ScopedLogSection section_1;
  string local_3a0;
  ShaderSource local_380;
  ShaderSource local_358;
  ShaderSource local_330;
  ProgramSources local_308;
  undefined1 local_238 [8];
  ShaderProgram program;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string geometrySource;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  ScopedLogSection local_d0;
  ScopedLogSection section;
  allocator<char> local_bd;
  int ndx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string fragmentSource;
  allocator<char> local_65;
  ApiType local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string vertexSource;
  bool supportsES32;
  GeometryProgramQueryCase *this_local;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  vertexSource.field_2._12_4_ = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,(ApiType)vertexSource.field_2._12_4_);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_64.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  GVar3 = glu::getContextTypeGLSLVersion((ContextType)local_64.m_bits);
  pcVar6 = glu::getGLSLVersionDeclaration(GVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar6,&local_65);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"\nvoid main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n}\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_65);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ndx = (*pRVar5->_vptr_RenderContext[2])();
  GVar3 = glu::getContextTypeGLSLVersion((ContextType)ndx);
  pcVar6 = glu::getGLSLVersionDeclaration(GVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar6,&local_bd);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_b8,
                 "\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main ()\n{\n\tfragColor = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_bd);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  for (section.m_log._4_4_ = 0; iVar1 = section.m_log._4_4_,
      sVar7 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
              ::size(&this->m_cases), iVar1 < (int)sVar7;
      section.m_log._4_4_ = section.m_log._4_4_ + 1) {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Case",&local_f1);
    pvVar9 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
             ::operator[](&this->m_cases,(long)section.m_log._4_4_);
    pcVar6 = pvVar9->description;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,pcVar6,
               (allocator<char> *)(geometrySource.field_2._M_local_buf + 0xf));
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,pTVar8,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)(geometrySource.field_2._M_local_buf + 0xf))
    ;
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    pvVar9 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
             ::operator[](&this->m_cases,(long)section.m_log._4_4_);
    __s = iterate::s_geometryBody;
    pcVar6 = pvVar9->header;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,__s,
               (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   pcVar6,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_308);
    glu::VertexSource::VertexSource((VertexSource *)&local_330,(string *)local_40);
    pPVar10 = glu::ProgramSources::operator<<(&local_308,&local_330);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_358,(string *)local_98);
    pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_358);
    pRVar11 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    section_1.m_log._4_4_ = (*pRVar11->_vptr_RenderContext[2])();
    specializeShader(&local_3a0,(string *)local_140,(ContextType *)((long)&section_1.m_log + 4));
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_380,&local_3a0);
    pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_380);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_238,pRVar5,pPVar10);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_358);
    glu::VertexSource::~VertexSource((VertexSource *)&local_330);
    glu::ProgramSources::~ProgramSources(&local_308);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(pTVar8,(ShaderProgram *)local_238);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_238);
    pvVar9 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
             ::operator[](&this->m_cases,(long)section.m_log._4_4_);
    expectProgramValue(this,dVar4,pvVar9->value);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_238);
    std::__cxx11::string::~string((string *)local_140);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
  }
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"NoGeometryShader",&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"No geometry shader",
             (allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_3b0,pTVar8,&local_3d0,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_5a0);
  glu::VertexSource::VertexSource((VertexSource *)&local_5c8,(string *)local_40);
  pPVar10 = glu::ProgramSources::operator<<(&local_5a0,&local_5c8);
  glu::FragmentSource::FragmentSource((FragmentSource *)&section_2,(string *)local_98);
  pPVar10 = glu::ProgramSources::operator<<(pPVar10,(ShaderSource *)&section_2);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_4d0,pRVar5,pPVar10);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&section_2);
  glu::VertexSource::~VertexSource((VertexSource *)&local_5c8);
  glu::ProgramSources::~ProgramSources(&local_5a0);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar8,(ShaderProgram *)local_4d0);
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4d0);
  expectQueryError(this,dVar4);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_4d0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_3b0);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"NotLinkedProgram",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"Shader program not linked",
             (allocator<char> *)(geometrySource_1.field_2._M_local_buf + 0xf));
  tcu::ScopedLogSection::ScopedLogSection(&local_5f8,pTVar8,&local_618,&local_640);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator((allocator<char> *)(geometrySource_1.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_6ec.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  GVar3 = glu::getContextTypeGLSLVersion((ContextType)local_6ec.m_bits);
  pcVar6 = glu::getGLSLVersionDeclaration(GVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,pcVar6,&local_6ed);
  std::operator+(&local_6c8,&local_6e8,"\n");
  pcVar6 = "#extension GL_EXT_geometry_shader : require\n";
  if (bVar2) {
    pcVar6 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,pcVar6,&local_711);
  std::operator+(&local_6a8,&local_6c8,&local_710);
  std::operator+(&local_688,&local_6a8,
                 "layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n");
  pcVar6 = iterate::s_geometryBody;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,pcVar6,(allocator<char> *)((long)&vtxSourcePtr + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668,
                 &local_688,&local_738);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator((allocator<char> *)((long)&vtxSourcePtr + 7));
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6ed);
  fragSourcePtr = (char *)std::__cxx11::string::c_str();
  geomSourcePtr = (char *)std::__cxx11::string::c_str();
  vertexShader.m_info.compileTimeUs = std::__cxx11::string::c_str();
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::Shader::Shader((Shader *)&fragmentShader.m_info.compileTimeUs,pRVar5,SHADERTYPE_VERTEX);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::Shader::Shader((Shader *)&geometryShader.m_info.compileTimeUs,pRVar5,SHADERTYPE_FRAGMENT);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::Shader::Shader((Shader *)&program_2.m_info.linkTimeUs,pRVar5,SHADERTYPE_GEOMETRY);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::Program::Program((Program *)local_8d0,pRVar5);
  glu::Shader::setSources
            ((Shader *)&fragmentShader.m_info.compileTimeUs,1,&fragSourcePtr,(int *)0x0);
  glu::Shader::setSources
            ((Shader *)&geometryShader.m_info.compileTimeUs,1,&geomSourcePtr,(int *)0x0);
  glu::Shader::setSources
            ((Shader *)&program_2.m_info.linkTimeUs,1,(char **)&vertexShader.m_info.compileTimeUs,
             (int *)0x0);
  glu::Shader::compile((Shader *)&fragmentShader.m_info.compileTimeUs);
  glu::Shader::compile((Shader *)&geometryShader.m_info.compileTimeUs);
  glu::Shader::compile((Shader *)&program_2.m_info.linkTimeUs);
  bVar2 = glu::Shader::getCompileStatus((Shader *)&fragmentShader.m_info.compileTimeUs);
  if (((bVar2) &&
      (bVar2 = glu::Shader::getCompileStatus((Shader *)&geometryShader.m_info.compileTimeUs), bVar2)
      ) && (bVar2 = glu::Shader::getCompileStatus((Shader *)&program_2.m_info.linkTimeUs), bVar2)) {
    dVar4 = glu::Shader::getShader((Shader *)&fragmentShader.m_info.compileTimeUs);
    glu::Program::attachShader((Program *)local_8d0,dVar4);
    dVar4 = glu::Shader::getShader((Shader *)&geometryShader.m_info.compileTimeUs);
    glu::Program::attachShader((Program *)local_8d0,dVar4);
    dVar4 = glu::Shader::getShader((Shader *)&program_2.m_info.linkTimeUs);
    glu::Program::attachShader((Program *)local_8d0,dVar4);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_a78,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_a78,
                         (char (*) [60])
                         "Creating a program with geometry shader, but not linking it");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a78);
    dVar4 = glu::Program::getProgram((Program *)local_8d0);
    expectQueryError(this,dVar4);
    glu::Program::~Program((Program *)local_8d0);
    glu::Shader::~Shader((Shader *)&program_2.m_info.linkTimeUs);
    glu::Shader::~Shader((Shader *)&geometryShader.m_info.compileTimeUs);
    glu::Shader::~Shader((Shader *)&fragmentShader.m_info.compileTimeUs);
    std::__cxx11::string::~string((string *)local_668);
    tcu::ScopedLogSection::~ScopedLogSection(&local_5f8);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_40);
    return STOP;
  }
  local_8f2 = 1;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"Failed to compile shader",&local_8f1);
  tcu::TestError::TestError(this_00,&local_8f0);
  local_8f2 = 0;
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

GeometryProgramQueryCase::IterateResult GeometryProgramQueryCase::iterate (void)
{
	const bool			supportsES32			= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	const std::string	vertexSource			= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
												  "void main ()\n"
												  "{\n"
												  "	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "}\n";
	const std::string	fragmentSource			= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
												  "layout(location = 0) out mediump vec4 fragColor;\n"
												  "void main ()\n"
												  "{\n"
												  "	fragColor = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "}\n";
	static const char*	s_geometryBody			="void main ()\n"
												  "{\n"
												  "	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "	EmitVertex();\n"
												  "}\n";

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// default cases
	for (int ndx = 0; ndx < (int)m_cases.size(); ++ndx)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "Case", m_cases[ndx].description);
		const std::string			geometrySource	= m_cases[ndx].header + std::string(s_geometryBody);
		const glu::ShaderProgram	program			(m_context.getRenderContext(),
														glu::ProgramSources()
														<< glu::VertexSource(vertexSource)
														<< glu::FragmentSource(fragmentSource)
														<< glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType())));

		m_testCtx.getLog() << program;
		expectProgramValue(program.getProgram(), m_cases[ndx].value);
	}

	// no geometry shader -case (INVALID OP)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "NoGeometryShader", "No geometry shader");
		const glu::ShaderProgram	program			(m_context.getRenderContext(),
														glu::ProgramSources()
														<< glu::VertexSource(vertexSource)
														<< glu::FragmentSource(fragmentSource));

		m_testCtx.getLog() << program;
		expectQueryError(program.getProgram());
	}

	// not linked -case (INVALID OP)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "NotLinkedProgram", "Shader program not linked");
		const std::string	geometrySource				= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
														+ std::string(supportsES32 ? "" : "#extension GL_EXT_geometry_shader : require\n")
														+ "layout (triangles) in;\n"
														"layout (points, max_vertices = 3) out;\n"
														+ std::string(s_geometryBody);


		const char* const			vtxSourcePtr	= vertexSource.c_str();
		const char* const			fragSourcePtr	= fragmentSource.c_str();
		const char* const			geomSourcePtr	= geometrySource.c_str();

		glu::Shader					vertexShader	(m_context.getRenderContext(), glu::SHADERTYPE_VERTEX);
		glu::Shader					fragmentShader	(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);
		glu::Shader					geometryShader	(m_context.getRenderContext(), glu::SHADERTYPE_GEOMETRY);
		glu::Program				program			(m_context.getRenderContext());

		vertexShader.setSources(1, &vtxSourcePtr, DE_NULL);
		fragmentShader.setSources(1, &fragSourcePtr, DE_NULL);
		geometryShader.setSources(1, &geomSourcePtr, DE_NULL);

		vertexShader.compile();
		fragmentShader.compile();
		geometryShader.compile();

		if (!vertexShader.getCompileStatus()   ||
			!fragmentShader.getCompileStatus() ||
			!geometryShader.getCompileStatus())
			throw tcu::TestError("Failed to compile shader");

		program.attachShader(vertexShader.getShader());
		program.attachShader(fragmentShader.getShader());
		program.attachShader(geometryShader.getShader());

		m_testCtx.getLog() << tcu::TestLog::Message << "Creating a program with geometry shader, but not linking it" << tcu::TestLog::EndMessage;

		expectQueryError(program.getProgram());
	}

	return STOP;
}